

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool anon_unknown.dwarf_8df1c::SameArguments(TypeFunction *a,TypeFunction *b)

{
  TypeHandle *local_30;
  TypeHandle *cb;
  TypeHandle *ca;
  TypeFunction *b_local;
  TypeFunction *a_local;
  
  cb = (a->arguments).head;
  local_30 = (b->arguments).head;
  while( true ) {
    if (cb == (TypeHandle *)0x0 || local_30 == (TypeHandle *)0x0) {
      return cb == local_30;
    }
    if (cb->type != local_30->type) break;
    cb = cb->next;
    local_30 = local_30->next;
  }
  return false;
}

Assistant:

bool SameArguments(TypeFunction *a, TypeFunction *b)
	{
		TypeHandle *ca = a->arguments.head;
		TypeHandle *cb = b->arguments.head;

		for(; ca && cb; ca = ca->next, cb = cb->next)
		{
			if(ca->type != cb->type)
				return false;
		}

		return ca == cb;
	}